

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

Boolean __thiscall Js::ConfigFlagsTable::GetDefaultValueAsBoolean(ConfigFlagsTable *this,Flag flag)

{
  code *pcVar1;
  Boolean BVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  
  switch(CONCAT62(in_register_00000032,flag) & 0xffffffff) {
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x438,"(false)","false");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x17:
  case 0x18:
  case 0x1b:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2d:
  case 0x32:
  case 0x34:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x3d:
  case 0x43:
  case 0x44:
  case 0x48:
  case 0x4a:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5f:
  case 100:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x74:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x99:
  case 0x9a:
  case 0xa3:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd2:
  case 0xd3:
  case 0xd8:
  case 0xdb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x106:
  case 0x12e:
  case 0x12f:
  case 0x134:
  case 0x140:
  case 0x141:
  case 0x142:
  case 0x143:
  case 0x145:
  case 0x147:
  case 0x149:
  case 0x14a:
  case 0x150:
  case 0x152:
  case 0x153:
  case 0x154:
  case 0x159:
  case 0x15b:
  case 0x15c:
  case 0x15d:
  case 0x15e:
  case 0x15f:
  case 0x166:
  case 0x167:
  case 0x168:
  case 0x169:
  case 0x16a:
  case 0x16b:
  case 0x16c:
  case 0x16d:
  case 0x16e:
  case 0x174:
  case 0x175:
  case 0x179:
  case 0x17c:
  case 0x17d:
  case 0x17e:
  case 0x185:
  case 0x186:
  case 0x18e:
  case 399:
  case 400:
  case 0x191:
  case 0x192:
  case 0x193:
  case 0x194:
  case 0x196:
  case 0x198:
  case 0x199:
  case 0x19b:
  case 0x19c:
  case 0x19d:
  case 0x19e:
  case 0x1a1:
  case 0x1a4:
  case 0x1a5:
  case 0x1a9:
  case 0x1ac:
  case 0x1b1:
  case 0x1b2:
  case 0x1b3:
  case 0x1b6:
  case 0x1b7:
  case 0x1b8:
  case 0x1b9:
  case 0x1ba:
  case 0x1c5:
  case 0x1c8:
  case 0x1cf:
  case 0x1d0:
  case 0x1d2:
  case 0x1d4:
    BVar2 = false;
    break;
  case 9:
  case 0xc:
  case 0xf:
  case 0x11:
  case 0x14:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x20:
  case 0x2c:
  case 0x31:
  case 0x35:
  case 0x3c:
  case 0x49:
  case 0x4b:
  case 0x5e:
  case 0x60:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x98:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa4:
  case 0xa6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 199:
  case 0x107:
  case 0x108:
  case 0x109:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x144:
  case 0x146:
  case 0x155:
  case 0x165:
  case 0x171:
  case 0x172:
  case 0x178:
  case 0x195:
  case 0x19a:
  case 0x19f:
  case 0x1a0:
  case 0x1a2:
  case 0x1a8:
  case 0x1ae:
  case 0x1af:
  case 0x1b0:
  case 0x1bb:
  case 0x1c1:
  case 0x1d1:
  case 0x1d3:
    BVar2 = true;
  }
  return BVar2;
}

Assistant:

Boolean
    ConfigFlagsTable::GetDefaultValueAsBoolean(Flag flag) const
    {
        Boolean retValue = FALSE;

        switch (flag)
        {
#define FLAG(type, name, description, defaultValue, ...) FLAGDEFAULT##type(name, defaultValue)
            // define an overload for each FlagTypes - type
            //   * all defaults we don't care about
#define FLAGDEFAULTPhases(name, defaultValue)
#define FLAGDEFAULTString(name, defaultValue)
#define FLAGDEFAULTNumber(name, defaultValue)
#define FLAGDEFAULTNumberSet(name, defaultValue)
#define FLAGDEFAULTNumberRange(name, defaultValue)
#define FLAGDEFAULTNumberPairSet(name, defaultValue)
#define FLAGDEFAULTNumberTrioSet(name, defaultValue)
            //   * and those we do care about
#define FLAGDEFAULTBoolean(name, defaultValue) \
        case name##Flag: \
            retValue = (Boolean) defaultValue; \
            break; \

#include "ConfigFlagsList.h"

#undef FLAGDEFAULTBoolean
#undef FLAGDEFAULTNumberRange
#undef FLAGDEFAULTNumberPairSet
#undef FLAGDEFAULTNumberTrioSet
#undef FLAGDEFAULTNumberSet
#undef FLAGDEFAULTNumber
#undef FLAGDEFAULTString
#undef FLAGDEFAULTPhases
#undef FLAG

#undef FLAGREGOVREXPBoolean
#undef FLAGREGOVREXPNumberRange
#undef FLAGREGOVREXPNumberPairSet
#undef FLAGREGOVREXPNumberTrioSet
#undef FLAGREGOVREXPNumberSet
#undef FLAGREGOVREXPNumber
#undef FLAGREGOVREXPString
#undef FLAGREGOVREXPPhases

#undef FLAGREGOVRBoolean
#undef FLAGREGOVRNumberRange
#undef FLAGREGOVRNumberPairSet
#undef FLAGREGOVRNumberTrioSet
#undef FLAGREGOVRNumberSet
#undef FLAGREGOVRNumber
#undef FLAGREGOVRString
#undef FLAGREGOVRPhases

        default:
            // not found - or not a boolean flag
            Assert(false);
        }

        return retValue;
    }